

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *Cluster,ebml_master *SegmentInfo)

{
  ebml_master *Element;
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_master *local_18;
  
  local_18 = SegmentInfo;
  peVar1 = MATROSKA_getContextCluster();
  bVar2 = EBML_ElementIsType((ebml_element *)Cluster,peVar1);
  Element = local_18;
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x1eb,
                  "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
  }
  peVar1 = MATROSKA_getContextInfo();
  bVar2 = EBML_ElementIsType(&Element->Base,peVar1);
  if (bVar2 != 0) {
    if (Cluster != (matroska_cluster *)0x0) {
      (**(code **)((long)(Cluster->Base).Base.Base.Base.VMT + 0x20))(Cluster,0x101,&local_18,8);
      return 0;
    }
    __assert_fail("(const void*)(Cluster)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x1ed,
                  "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x1ec,
                "err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *, ebml_master *)");
}

Assistant:

err_t MATROSKA_LinkClusterWriteSegmentInfo(matroska_cluster *Cluster, ebml_master *SegmentInfo)
{
    assert(EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster()));
    assert(EBML_ElementIsType((ebml_element*)SegmentInfo, MATROSKA_getContextInfo()));
    Node_SET(Cluster,MATROSKA_CLUSTER_WRITE_SEGMENTINFO,&SegmentInfo);
    return ERR_NONE;
}